

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  bool bVar1;
  int iVar2;
  int local_38;
  int local_30;
  int local_2c;
  int iFanout;
  int i;
  Aig_Obj_t *pFanout;
  Vec_Ptr_t *vCone_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_30 = -1;
  iVar2 = Saig_ObjIsLi(p,pObj);
  if ((iVar2 == 0) && ((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0)) {
    if ((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0) {
      iVar2 = Aig_ObjIsNode(pObj);
      if (iVar2 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                      ,0x405,
                      "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)"
                     );
      }
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
      iVar2 = Aig_ObjIsNode(pObj);
      if (iVar2 != 0) {
        Vec_PtrPush(vCone,pObj);
      }
    }
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                    ,0x40a,
                    "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)")
      ;
    }
    local_2c = 0;
    while( true ) {
      bVar1 = false;
      if (local_2c < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
        if (local_2c == 0) {
          local_38 = Aig_ObjFanout0Int(p,pObj->Id);
        }
        else {
          local_38 = Aig_ObjFanoutNext(p,local_30);
        }
        local_30 = local_38;
        _iFanout = Aig_ManObj(p,local_38 >> 1);
        bVar1 = true;
      }
      if (!bVar1) break;
      Llb_ManFlowCollectAndMarkCone_rec(p,_iFanout,vCone);
      local_2c = local_2c + 1;
    }
  }
  return;
}

Assistant:

void Llb_ManFlowCollectAndMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Saig_ObjIsLi(p, pObj) )
        return;
    if ( pObj->fMarkB )
        return;
    if ( pObj->fMarkA == 0 )
    {
        assert( Aig_ObjIsNode(pObj) );
        pObj->fMarkB = 1;
        if ( Aig_ObjIsNode(pObj) )
            Vec_PtrPush( vCone, pObj );
    }
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Llb_ManFlowCollectAndMarkCone_rec( p, pFanout, vCone );
}